

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O3

UA_StatusCode writeNamespaces(void *handle,UA_NodeId nodeid,UA_Variant *data,UA_NumericRange *range)

{
  void *pvVar1;
  ulong uVar2;
  long lVar3;
  size_t __n;
  UA_StatusCode UVar4;
  int iVar5;
  UA_Server *server;
  long lVar6;
  ulong uVar7;
  long lVar8;
  undefined8 *puVar9;
  UA_String name;
  
  UVar4 = 0x80740000;
  if ((data->type != (UA_DataType *)0x13e5c0) || (pvVar1 = data->data, pvVar1 == (void *)0x0)) {
    return 0x80740000;
  }
  if (range != (UA_NumericRange *)0x0) {
    return 0x80020000;
  }
  uVar2 = *(ulong *)((long)handle + 0x58);
  lVar8 = data->arrayLength - uVar2;
  if (uVar2 <= data->arrayLength && lVar8 != 0) {
    if (uVar2 != 0) {
      lVar3 = *(long *)((long)handle + 0x60);
      lVar6 = 8;
      uVar7 = uVar2;
      do {
        __n = *(size_t *)(lVar3 + -8 + lVar6);
        if ((__n != *(size_t *)((long)pvVar1 + lVar6 + -8)) ||
           (iVar5 = bcmp(*(void **)(lVar3 + lVar6),*(void **)((long)pvVar1 + lVar6),__n), iVar5 != 0
           )) {
          return 0x80020000;
        }
        lVar6 = lVar6 + 0x10;
        uVar7 = uVar7 - 1;
      } while (uVar7 != 0);
    }
    puVar9 = (undefined8 *)((long)pvVar1 + uVar2 * 0x10 + 8);
    do {
      name.data = (UA_Byte *)*puVar9;
      name.length = puVar9[-1];
      addNamespace((UA_Server *)handle,name);
      puVar9 = puVar9 + 2;
      UVar4 = 0;
      lVar8 = lVar8 + -1;
    } while (lVar8 != 0);
  }
  return UVar4;
}

Assistant:

static UA_StatusCode
writeNamespaces(void *handle, const UA_NodeId nodeid, const UA_Variant *data,
                const UA_NumericRange *range) {
    UA_Server *server = (UA_Server*)handle;

    /* Check the data type */
    if(data->type != &UA_TYPES[UA_TYPES_STRING])
        return UA_STATUSCODE_BADTYPEMISMATCH;

    /* Check that the variant is not empty */
    if(!data->data)
        return UA_STATUSCODE_BADTYPEMISMATCH;

    /* TODO: Writing with a range is not implemented */
    if(range)
        return UA_STATUSCODE_BADINTERNALERROR;

    UA_String *newNamespaces = data->data;
    size_t newNamespacesSize = data->arrayLength;

    /* Test if we append to the existing namespaces */
    if(newNamespacesSize <= server->namespacesSize)
        return UA_STATUSCODE_BADTYPEMISMATCH;

    /* Test if the existing namespaces are unchanged */
    for(size_t i = 0; i < server->namespacesSize; ++i) {
        if(!UA_String_equal(&server->namespaces[i], &newNamespaces[i]))
            return UA_STATUSCODE_BADINTERNALERROR;
    }

    /* Add namespaces */
    for(size_t i = server->namespacesSize; i < newNamespacesSize; ++i)
        addNamespace(server, newNamespaces[i]);
    return UA_STATUSCODE_GOOD;
}